

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O0

void __thiscall sf::Shape::draw(Shape *this,RenderTarget *target,RenderStates states)

{
  float fVar1;
  VertexBuffer *pVVar2;
  bool bVar3;
  RenderTarget *in_RSI;
  RenderStates *in_RDI;
  RenderStates *in_stack_000000b0;
  Drawable *in_stack_000000b8;
  RenderTarget *in_stack_000000c0;
  Transform *in_stack_ffffffffffffffd8;
  VertexBuffer *vertexBuffer;
  
  vertexBuffer = (VertexBuffer *)&stack0x00000008;
  Transformable::getTransform((Transformable *)states.transform.m_matrix._8_8_);
  operator*=((Transform *)in_RDI,in_stack_ffffffffffffffd8);
  fVar1 = in_RDI[1].transform.m_matrix[0xf];
  pVVar2 = vertexBuffer + 2;
  vertexBuffer[2].m_primitiveType = (PrimitiveType)in_RDI[1].transform.m_matrix[0xe];
  pVVar2->m_usage = (Usage)fVar1;
  bVar3 = VertexBuffer::isAvailable();
  if (bVar3) {
    RenderTarget::draw(in_RSI,vertexBuffer,in_RDI);
  }
  else {
    RenderTarget::draw(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  }
  fVar1 = (float)in_RDI[2].blendMode.colorEquation;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    vertexBuffer[2].m_primitiveType = Points;
    vertexBuffer[2].m_usage = Stream;
    bVar3 = VertexBuffer::isAvailable();
    if (bVar3) {
      RenderTarget::draw(in_RSI,vertexBuffer,in_RDI);
    }
    else {
      RenderTarget::draw(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
    }
  }
  return;
}

Assistant:

void Shape::draw(RenderTarget& target, RenderStates states) const
{
    states.transform *= getTransform();

    // Render the inside
    states.texture = m_texture;

    if (VertexBuffer::isAvailable())
    {
        target.draw(m_verticesBuffer, states);
    }
    else
    {
        target.draw(m_vertices, states);
    }

    // Render the outline
    if (m_outlineThickness != 0)
    {
        states.texture = NULL;

        if (VertexBuffer::isAvailable())
        {
            target.draw(m_outlineVerticesBuffer, states);
        }
        else
        {
            target.draw(m_outlineVertices, states);
        }
    }
}